

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TableSetColumnIndex(int column_n)

{
  ImGuiTable *table;
  bool bVar1;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    bVar1 = false;
  }
  else {
    if (table->CurrentColumn != column_n) {
      if (table->CurrentColumn != -1) {
        TableEndCell(table);
      }
      if ((column_n < 0) || (table->ColumnsCount == 0)) {
        __assert_fail("column_n >= 0 && table->ColumnsCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                      ,0x28a4,"bool ImGui::TableSetColumnIndex(int)");
      }
      TableBeginCell(table,column_n);
    }
    bVar1 = (table->VisibleUnclippedMaskByIndex >> ((ulong)(uint)column_n & 0x3f) & 1) != 0;
  }
  return bVar1;
}

Assistant:

bool    ImGui::TableSetColumnIndex(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->CurrentColumn != column_n)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        IM_ASSERT(column_n >= 0 && table->ColumnsCount);
        TableBeginCell(table, column_n);
    }

    // FIXME-TABLE: it is likely to alter layout if user skips a columns contents based on clipping.
    return (table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)) != 0;
}